

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float *pfVar12;
  ImFontGlyph *pIVar13;
  ImFontGlyph *pIVar14;
  char *__function;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  
  uVar19 = (this->Glyphs).Size;
  if ((ulong)uVar19 == 0) {
    uVar21 = 1;
  }
  else {
    uVar21 = 0;
    uVar20 = 0;
    if (0 < (int)uVar19) {
      uVar20 = uVar19;
    }
    if (uVar20 <= uVar19 - 1) {
      __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
      goto LAB_00178ab5;
    }
    lVar15 = 0;
    do {
      uVar20 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar15) & 0x7fffffff;
      if (uVar20 < uVar21) {
        uVar20 = uVar21;
      }
      uVar21 = uVar20;
      lVar15 = lVar15 + 0x28;
    } while ((ulong)uVar19 * 0x28 != lVar15);
    if (0xfffe < (int)uVar19) {
      __assert_fail("Glyphs.Size < 0xFFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0xa47,"void ImFont::BuildLookupTable()");
    }
    uVar21 = uVar21 + 1;
  }
  pfVar4 = (this->IndexAdvanceX).Data;
  if (pfVar4 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar4);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar5 = (this->IndexLookup).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar5);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar21);
  uVar19 = (this->Glyphs).Size;
  uVar18 = (ulong)uVar19;
  if (0 < (int)uVar19) {
    iVar2 = (this->IndexAdvanceX).Size;
    pfVar4 = (this->IndexAdvanceX).Data;
    iVar3 = (this->IndexLookup).Size;
    puVar5 = (this->IndexLookup).Data;
    pfVar12 = &((this->Glyphs).Data)->AdvanceX;
    uVar16 = 0;
    do {
      uVar20 = *(uint *)(pfVar12 + -1);
      uVar17 = uVar20 & 0x7fffffff;
      if (iVar2 <= (int)uVar17) goto LAB_00178a89;
      pfVar4[uVar17] = *pfVar12;
      if (iVar3 <= (int)uVar17) goto LAB_00178aa0;
      puVar5[uVar17] = (unsigned_short)uVar16;
      this->Used4kPagesMap[uVar17 >> 0xf] =
           this->Used4kPagesMap[uVar17 >> 0xf] | (byte)(1 << ((byte)(uVar20 >> 0xc) & 7));
      uVar16 = uVar16 + 1;
      pfVar12 = pfVar12 + 10;
    } while (uVar18 != uVar16);
  }
  uVar20 = (this->IndexLookup).Size;
  if ((uVar20 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar13 == (ImFontGlyph *)0x0) {
LAB_001789a7:
    if ((uVar20 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      pIVar13->field_0x3 = pIVar13->field_0x3 & 0x7f;
      uVar20 = (this->IndexLookup).Size;
    }
    if ((uVar20 < 10) || (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      pIVar13->field_0x3 = pIVar13->field_0x3 & 0x7f;
      uVar20 = (this->IndexLookup).Size;
    }
    if (((ulong)this->FallbackChar < (ulong)(long)(int)uVar20) &&
       (uVar18 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar18 != 0xffff)) {
      pIVar14 = (this->Glyphs).Data;
      pIVar13 = pIVar14 + uVar18;
      this->FallbackGlyph = pIVar13;
      if (pIVar14 == (ImFontGlyph *)0x0) goto LAB_00178a4c;
      fVar22 = pIVar13->AdvanceX;
    }
    else {
      this->FallbackGlyph = (ImFontGlyph *)0x0;
LAB_00178a4c:
      fVar22 = 0.0;
    }
    this->FallbackAdvanceX = fVar22;
    uVar19 = (this->IndexAdvanceX).Size;
    pfVar4 = (this->IndexAdvanceX).Data;
    uVar16 = 0;
    uVar18 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar18 = uVar16;
    }
    while (uVar18 != uVar16) {
      pfVar12 = pfVar4 + uVar16;
      if (*pfVar12 <= 0.0 && *pfVar12 != 0.0) {
        pfVar4[uVar16] = fVar22;
      }
      uVar16 = uVar16 + 1;
      if (uVar21 == uVar16) {
        return;
      }
    }
  }
  else {
    if ((int)uVar19 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x538,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    pIVar13 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar13[uVar18 - 1] & (undefined1  [40])0x7fffffff) !=
        (undefined1  [40])0x9) {
      uVar18 = uVar18 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= (int)uVar19) {
        if (iVar2 == 0) {
          uVar19 = 8;
        }
        else {
          uVar19 = iVar2 / 2 + iVar2;
        }
        uVar16 = (ulong)uVar19;
        if ((int)uVar19 <= (int)uVar18) {
          uVar16 = uVar18 & 0xffffffff;
        }
        pIVar13 = (ImFontGlyph *)ImGui::MemAlloc(uVar16 * 0x28);
        pIVar14 = (this->Glyphs).Data;
        if (pIVar14 != (ImFontGlyph *)0x0) {
          memcpy(pIVar13,pIVar14,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar13;
        (this->Glyphs).Capacity = (int)uVar16;
        uVar20 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = (int)uVar18;
    }
    if ((uVar20 < 0x21) || (uVar16 = (ulong)(this->IndexLookup).Data[0x20], uVar16 == 0xffff)) {
      pIVar14 = this->FallbackGlyph;
    }
    else {
      pIVar14 = pIVar13 + uVar16;
    }
    fVar22 = pIVar14->V1;
    pIVar13[uVar18 - 1].U1 = pIVar14->U1;
    pIVar13[uVar18 - 1].V1 = fVar22;
    uVar8 = *(undefined4 *)&pIVar14->field_0x0;
    fVar9 = pIVar14->AdvanceX;
    fVar10 = pIVar14->X0;
    fVar11 = pIVar14->Y0;
    fVar22 = pIVar14->Y1;
    fVar6 = pIVar14->U0;
    fVar7 = pIVar14->V0;
    pIVar13[uVar18 - 1].X1 = pIVar14->X1;
    pIVar13[uVar18 - 1].Y1 = fVar22;
    pIVar13[uVar18 - 1].U0 = fVar6;
    pIVar13[uVar18 - 1].V0 = fVar7;
    *(undefined4 *)&pIVar13[uVar18 - 1].field_0x0 = uVar8;
    pIVar13[uVar18 - 1].AdvanceX = fVar9;
    pIVar13[uVar18 - 1].X0 = fVar10;
    pIVar13[uVar18 - 1].Y0 = fVar11;
    *(uint *)(pIVar13 + (uVar18 - 1)) = *(uint *)(pIVar13 + (uVar18 - 1)) & 0x80000000 | 9;
    fVar22 = pIVar13[uVar18 - 1].AdvanceX * 4.0;
    pIVar13[uVar18 - 1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      uVar20 = (this->IndexLookup).Size;
      if ((int)uVar20 <= (int)(*(uint *)(pIVar13 + (uVar18 - 1)) & 0x7fffffff)) {
LAB_00178aa0:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_00178ab5;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar13 + (uVar18 - 1)) & 0x7fffffff] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_001789a7;
    }
  }
LAB_00178a89:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00178ab5:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x52e,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}